

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_reset(REF_INTERP ref_interp)

{
  int *piVar1;
  REF_INT max;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  max = ref_interp->to_grid->node->max;
  uVar2 = ref_interp->max;
  uVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  while (uVar5 != uVar3) {
    piVar1 = ref_interp->agent_hired + uVar3;
    uVar3 = uVar3 + 1;
    if (*piVar1 != 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xe1
             ,"ref_interp_reset","agent should not be hired during reset");
      return 1;
    }
  }
  if (((int)uVar2 < max) && (uVar2 = ref_interp_resize(ref_interp,max), uVar2 != 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xe4,
           "ref_interp_reset",(ulong)uVar2,"protective resize");
    return uVar2;
  }
  for (lVar4 = 0; uVar3 = (ulong)ref_interp->max, lVar4 < (long)uVar3; lVar4 = lVar4 + 1) {
    ref_interp->cell[lVar4] = -1;
  }
  for (lVar4 = 0; lVar4 < (int)uVar3; lVar4 = lVar4 + 1) {
    ref_interp->part[lVar4] = -1;
    uVar3 = (ulong)(uint)ref_interp->max;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_interp_reset(REF_INTERP ref_interp) {
  REF_INT node_max =
      ref_node_max(ref_grid_node(ref_interp_to_grid(ref_interp)));
  REF_INT node;
  for (node = 0; node < ref_interp_max(ref_interp); node++) {
    RAS(!ref_interp->agent_hired[node],
        "agent should not be hired during reset");
  }
  if (node_max > ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, node_max), "protective resize");
  }
  for (node = 0; node < ref_interp_max(ref_interp); node++) {
    ref_interp->cell[node] = REF_EMPTY;
  }
  for (node = 0; node < ref_interp_max(ref_interp); node++) {
    ref_interp->part[node] = REF_EMPTY;
  }

  return REF_SUCCESS;
}